

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmeander.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  int iVar4;
  int iVar5;
  
  if (argc - 5U < 0xfffffffe) {
    main_cold_3();
  }
  else {
    iVar1 = atoi(argv[1]);
    if (iVar1 < 1) {
      main_cold_2();
    }
    else {
      iVar2 = atoi(argv[2]);
      if (0 < iVar2) {
        iVar4 = 0;
        iVar3 = 0;
        if (argc == 4) {
          iVar3 = atoi(argv[3]);
        }
        iVar3 = iVar3 % (iVar2 * 2);
        iVar5 = 1;
        if (1 < iVar1) {
          iVar5 = iVar1;
        }
LAB_00101239:
        do {
          iVar1 = iVar3;
          if (iVar1 < iVar2) {
            __s = "1";
          }
          else {
            iVar3 = 0;
            if (iVar2 * 2 <= iVar1) goto LAB_00101239;
            __s = "-1";
          }
          puts(__s);
          iVar4 = iVar4 + 1;
          iVar3 = iVar1 + 1;
          if (iVar4 == iVar5) {
            return 0;
          }
        } while( true );
      }
      main_cold_1();
    }
  }
  return 1;
}

Assistant:

int main (int argc, char* argv[])
{
    if(3 != argc && 4 != argc) {
	fprintf(stderr, "Usage: dmeander Length HalfPeriod [PhaseShift]\n");
	return 1;
    }

    int	nLength = atoi(argv[1]);
    if(nLength <= 0) {
	fprintf(stderr, "Length must be positive\n");
	return 1;
    }
    int	iHalfPeriod = atoi(argv[2]);
    if(iHalfPeriod <= 0) {
	fprintf(stderr, "Half of period must be positive\n");
	return 1;
    }
    int	iPeriod = 2 * iHalfPeriod;
    int iPhase = (4 == argc)? atoi(argv[3]): 0;

    int	i, j = iPhase % iPeriod;
    for(i = 0; i < nLength; ) {
	if(j < iHalfPeriod) {
	    printf("1\n");
	    ++j;
	} else if(j < iPeriod) {
	    printf("-1\n");
	    ++j;
	} else {
	    j = 0;
	    continue;
	}
	++i;
    }
    return 0;
}